

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall Nova::Driver<float,_3>::Initialize(Driver<float,_3> *this)

{
  int iVar1;
  Example<float,_3> *pEVar2;
  
  pEVar2 = this->example;
  if (pEVar2->restart == true) {
    this->current_frame = pEVar2->restart_frame;
    (*this->_vptr_Driver[6])(this);
  }
  else {
    this->current_frame = pEVar2->first_frame;
  }
  iVar1 = this->current_frame;
  this->output_number = iVar1;
  pEVar2 = this->example;
  this->time = (float)(iVar1 - pEVar2->first_frame) / pEVar2->frame_rate + pEVar2->initial_time;
  pEVar2->output_number = iVar1;
  pEVar2->current_frame = iVar1;
  return;
}

Assistant:

void Driver<T,d>::
Initialize()
{
    if(example.restart){current_frame=example.restart_frame;Read_Time(current_frame);}
    else current_frame=example.first_frame;
    output_number=current_frame;
    time=example.Time_At_Frame(current_frame);
    example.output_number=output_number;
    example.current_frame=current_frame;
}